

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int ingrouping(lys_node *node)

{
  bool bVar1;
  lys_node *local_20;
  lys_node *iter;
  lys_node *node_local;
  
  local_20 = node;
  if (node != (lys_node *)0x0) {
    while( true ) {
      bVar1 = false;
      if (local_20 != (lys_node *)0x0) {
        bVar1 = local_20->nodetype != LYS_GROUPING;
      }
      if (!bVar1) break;
      local_20 = lys_parent(local_20);
    }
    node_local._4_4_ = (uint)(local_20 != (lys_node *)0x0);
    return node_local._4_4_;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0xa84,"int ingrouping(const struct lys_node *)");
}

Assistant:

static int
ingrouping(const struct lys_node *node)
{
    const struct lys_node *iter = node;
    assert(node);

    for(iter = node; iter && iter->nodetype != LYS_GROUPING; iter = lys_parent(iter));
    if (!iter) {
        return 0;
    } else {
        return 1;
    }
}